

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,NewArrayExpression *expression)

{
  int iVar1;
  ArrayValue *this_00;
  PrimitiveArrayObject *this_01;
  PrimitiveSimpleObject *this_02;
  Type *this_03;
  Value *pVVar2;
  size_t size;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  string local_50;
  ArrayValue *local_20;
  ArrayValue *new_arr;
  NewArrayExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  new_arr = (ArrayValue *)expression;
  expression_local = (NewArrayExpression *)this;
  this_00 = (ArrayValue *)operator_new(0x30);
  size._3_1_ = 1;
  this_01 = (PrimitiveArrayObject *)operator_new(0x10);
  size._4_1_ = 1;
  this_02 = (PrimitiveSimpleObject *)operator_new(0x18);
  size._5_1_ = 1;
  this_03 = (Type *)operator_new(0x28);
  size._6_1_ = 1;
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_68._M_current = (char *)std::__cxx11::string::end();
  local_60 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator-(&local_68,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)&local_50,local_58,local_60,(allocator<char> *)((long)&size + 7));
  Type::Type(this_03,&local_50);
  size._6_1_ = 0;
  PrimitiveSimpleObject::PrimitiveSimpleObject(this_02,this_03);
  size._5_1_ = 0;
  PrimitiveArrayObject::PrimitiveArrayObject(this_01,this_02);
  size._4_1_ = 0;
  ArrayValue::ArrayValue(this_00,this_01);
  size._3_1_ = 0;
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
  local_20 = this_00;
  pVVar2 = TemplateVisitor<Value_*>::Accept
                     (&this->super_TemplateVisitor<Value_*>,(Node *)new_arr->element_type_);
  iVar1 = (*pVVar2->_vptr_Value[2])();
  ArrayValue::Resize(local_20,(long)iVar1);
  (this->super_TemplateVisitor<Value_*>).tos_value_ = &local_20->super_Value;
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(NewArrayExpression* expression) {
  auto new_arr = new ArrayValue(new PrimitiveArrayObject(
      new PrimitiveSimpleObject(new Type(std::string(
          expression->type_name_->type_name_.begin(), expression->type_name_->type_name_.end() - 2)))));

  size_t size = Accept(expression->length_)->GetValue();
  new_arr->Resize(size);
  tos_value_ = new_arr;
}